

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O2

void __thiscall
FIX::SessionFactory::processFixtDataDictionaries
          (SessionFactory *this,SessionID *sessionID,Dictionary *settings,
          DataDictionaryProvider *provider)

{
  _Rb_tree_node_base *__lhs;
  __type_conflict1 _Var1;
  long lVar2;
  _Base_ptr p_Var3;
  ConfigError *this_00;
  Dictionary *settings_00;
  Dictionary *settings_01;
  Dictionary *settings_02;
  string *this_01;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  DataDictionaryProvider *local_1c0;
  Dictionary *local_1b8;
  SessionID *local_1b0;
  string beginStringQualifier;
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  undefined1 local_170 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  string local_150;
  __shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2> local_130;
  string local_120 [32];
  FieldBase local_100;
  FieldBase local_a8;
  string frontKey;
  
  local_1c0 = provider;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"TransportDataDictionary",(allocator<char> *)&local_a8);
  createDataDictionary
            ((SessionFactory *)&pDataDictionary,(SessionID *)this,settings_00,(string *)settings);
  local_1b0 = (SessionID *)this;
  std::__cxx11::string::~string((string *)&local_100);
  std::__shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_130,
             &pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>);
  DataDictionaryProvider::addTransportDataDictionary
            (local_1c0,&sessionID->m_beginString,(shared_ptr<FIX::DataDictionary> *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  p_Var3 = (settings->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b8 = settings;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(settings->m_data)._M_t._M_impl.super__Rb_tree_header) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pDataDictionary.
                  super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __lhs = p_Var3 + 1;
    std::__cxx11::string::substr((ulong)&frontKey,(ulong)__lhs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"AppDataDictionary",(allocator<char> *)&beginStringQualifier);
    string_toUpper((string *)&local_100,(string *)&local_a8);
    _Var1 = std::operator==(&frontKey,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a8);
    if (_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"AppDataDictionary",(allocator<char> *)&beginStringQualifier);
      string_toUpper((string *)&local_100,(string *)&local_a8);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_a8);
      if (_Var1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"DefaultApplVerID",&local_1c1);
        Dictionary::getString(&beginStringQualifier,local_1b8,&local_150,false);
        BeginString::BeginString((BeginString *)&local_a8,&beginStringQualifier);
        Message::toApplVerID((ApplVerID *)&local_100,(BeginString *)&local_a8);
        std::__cxx11::string::string<std::allocator<char>>(local_120,"AppDataDictionary",&local_1c2)
        ;
        createDataDictionary
                  ((SessionFactory *)(local_170 + 0x10),local_1b0,settings_01,(string *)local_1b8);
        DataDictionaryProvider::addApplicationDataDictionary
                  (local_1c0,(ApplVerID *)&local_100,
                   (shared_ptr<FIX::DataDictionary> *)(local_170 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
        std::__cxx11::string::~string(local_120);
        FieldBase::~FieldBase(&local_100);
        FieldBase::~FieldBase(&local_a8);
        std::__cxx11::string::~string((string *)&beginStringQualifier);
        this_01 = &local_150;
      }
      else {
        lVar2 = std::__cxx11::string::find((char)__lhs,0x2e);
        if (lVar2 == -1) {
          this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"Malformed ",(allocator<char> *)local_120);
          std::operator+(&beginStringQualifier,&local_150,"AppDataDictionary");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a8,&beginStringQualifier,": ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
          ;
          ConfigError::ConfigError(this_00,(string *)&local_100);
          __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
        }
        std::__cxx11::string::substr((ulong)&beginStringQualifier,(ulong)__lhs);
        BeginString::BeginString((BeginString *)&local_a8,&beginStringQualifier);
        Message::toApplVerID((ApplVerID *)&local_100,(BeginString *)&local_a8);
        createDataDictionary((SessionFactory *)local_170,local_1b0,settings_02,(string *)local_1b8);
        DataDictionaryProvider::addApplicationDataDictionary
                  (local_1c0,(ApplVerID *)&local_100,(shared_ptr<FIX::DataDictionary> *)local_170);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
        FieldBase::~FieldBase(&local_100);
        FieldBase::~FieldBase(&local_a8);
        this_01 = &beginStringQualifier;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
    std::__cxx11::string::~string((string *)&frontKey);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

EXCEPT(ConfigError) {
  std::shared_ptr<DataDictionary> pDataDictionary
      = createDataDictionary(sessionID, settings, TRANSPORT_DATA_DICTIONARY);
  provider.addTransportDataDictionary(sessionID.getBeginString(), pDataDictionary);

  for (const Dictionary::value_type &data : settings) {
    const std::string &key = data.first;
    const std::string frontKey = key.substr(0, strlen(APP_DATA_DICTIONARY));
    if (frontKey == string_toUpper(APP_DATA_DICTIONARY)) {
      if (key == string_toUpper(APP_DATA_DICTIONARY)) {
        provider.addApplicationDataDictionary(
            Message::toApplVerID(settings.getString(DEFAULT_APPLVERID)),
            createDataDictionary(sessionID, settings, APP_DATA_DICTIONARY));
      } else {
        std::string::size_type offset = key.find('.');
        if (offset == std::string::npos) {
          throw ConfigError(std::string("Malformed ") + APP_DATA_DICTIONARY + ": " + key);
        }
        std::string beginStringQualifier = key.substr(offset + 1);
        provider.addApplicationDataDictionary(
            Message::toApplVerID(beginStringQualifier),
            createDataDictionary(sessionID, settings, key));
      }
    }
  }
}